

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

int coda_product_type_set_description(coda_product_type *product_type,char *description)

{
  char *pcVar1;
  int iVar2;
  
  if (product_type->description == (char *)0x0) {
    iVar2 = 0;
    if (description == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = strdup(description);
      if (pcVar1 == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                       ,0x20f);
        return -1;
      }
    }
    product_type->description = pcVar1;
  }
  else {
    coda_set_error(-400,"product type already has a description");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int coda_product_type_set_description(coda_product_type *product_type, const char *description)
{
    char *new_description = NULL;

    if (product_type->description != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product type already has a description");
        return -1;
    }
    if (description != NULL)
    {
        new_description = strdup(description);
        if (new_description == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
    }
    product_type->description = new_description;

    return 0;
}